

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverterSharedData *
ucnv_data_unFlattenClone(UConverterLoadArgs *pArgs,UDataMemory *pData,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  uint *puVar3;
  UConverterType type;
  UConverterSharedData *data;
  UConverterStaticData *source;
  uint8_t *raw;
  UErrorCode *status_local;
  UDataMemory *pData_local;
  UConverterLoadArgs *pArgs_local;
  
  puVar3 = (uint *)udata_getMemory_63(pData);
  uVar2 = (uint)*(char *)((long)puVar3 + 0x45);
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (((((uVar2 & 0xffff) < 0x22) && (converterData[(int)uVar2] != (UConverterSharedData *)0x0))
        && (converterData[(int)uVar2]->isReferenceCounted != '\0')) &&
       ((converterData[(int)uVar2]->referenceCounter == 1 && (*puVar3 == 100)))) {
      pArgs_local = (UConverterLoadArgs *)uprv_malloc_63(0x128);
      if (pArgs_local == (UConverterLoadArgs *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        pArgs_local = (UConverterLoadArgs *)0x0;
      }
      else {
        memcpy(pArgs_local,converterData[(int)uVar2],0x128);
        pArgs_local->pkg = (char *)puVar3;
        *(undefined1 *)&pArgs_local->name = 0;
        *(UDataMemory **)&pArgs_local->onlyTestIsLoadable = pData;
        if (*(long *)(pArgs_local->locale + 8) != 0) {
          (**(code **)(pArgs_local->locale + 8))
                    (pArgs_local,pArgs,(long)puVar3 + (ulong)*puVar3,status);
          UVar1 = U_FAILURE(*status);
          if (UVar1 != '\0') {
            uprv_free_63(pArgs_local);
            pArgs_local = (UConverterLoadArgs *)0x0;
          }
        }
      }
    }
    else {
      *status = U_INVALID_TABLE_FORMAT;
      pArgs_local = (UConverterLoadArgs *)0x0;
    }
  }
  else {
    pArgs_local = (UConverterLoadArgs *)0x0;
  }
  return (UConverterSharedData *)pArgs_local;
}

Assistant:

static UConverterSharedData*
ucnv_data_unFlattenClone(UConverterLoadArgs *pArgs, UDataMemory *pData, UErrorCode *status)
{
    /* UDataInfo info; -- necessary only if some converters have different formatVersion */
    const uint8_t *raw = (const uint8_t *)udata_getMemory(pData);
    const UConverterStaticData *source = (const UConverterStaticData *) raw;
    UConverterSharedData *data;
    UConverterType type = (UConverterType)source->conversionType;

    if(U_FAILURE(*status))
        return NULL;

    if( (uint16_t)type >= UCNV_NUMBER_OF_SUPPORTED_CONVERTER_TYPES ||
        converterData[type] == NULL ||
        !converterData[type]->isReferenceCounted ||
        converterData[type]->referenceCounter != 1 ||
        source->structSize != sizeof(UConverterStaticData))
    {
        *status = U_INVALID_TABLE_FORMAT;
        return NULL;
    }

    data = (UConverterSharedData *)uprv_malloc(sizeof(UConverterSharedData));
    if(data == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }

    /* copy initial values from the static structure for this type */
    uprv_memcpy(data, converterData[type], sizeof(UConverterSharedData));

    data->staticData = source;

    data->sharedDataCached = FALSE;

    /* fill in fields from the loaded data */
    data->dataMemory = (void*)pData; /* for future use */

    if(data->impl->load != NULL) {
        data->impl->load(data, pArgs, raw + source->structSize, status);
        if(U_FAILURE(*status)) {
            uprv_free(data);
            return NULL;
        }
    }
    return data;
}